

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZPersistenceManager.cpp
# Opt level: O2

void TPZPersistenceManager::WriteToFile(TPZSavable *obj)

{
  TPZSavable *pTVar1;
  int64_t iVar2;
  int iVar3;
  undefined8 in_RAX;
  int64_t iVar4;
  size_t sVar5;
  uint size;
  int classId;
  
  _size = in_RAX;
  iVar4 = ScheduleToWrite(obj);
  iVar2 = mMainObjIds.fNElements;
  (*mMainObjIds._vptr_TPZVec[3])(&mMainObjIds,(ulong)((int)mMainObjIds.fNElements + 1));
  mMainObjIds.fStore[iVar2 & 0xffffffff] = iVar4;
  while( true ) {
    if (mPointersToSave.fNElements <= mNextPointerToSave) {
      return;
    }
    TPZContBufferedStream::Write(&mObjectsStream,&mNextPointerToSave,1);
    pTVar1 = mPointersToSave.fStore[mNextPointerToSave];
    iVar3 = (*pTVar1->_vptr_TPZSavable[4])(pTVar1);
    classId = iVar3;
    if ((iVar3 == 0x29a) || (iVar3 == -1)) break;
    TPZContBufferedStream::Write(&mObjectsStream,&classId,1);
    TPZContBufferedStream::clear(&mCurrentObjectStream);
    (*pTVar1->_vptr_TPZSavable[5])(pTVar1,&mCurrentObjectStream,0);
    sVar5 = TPZContBufferedStream::Size(&mCurrentObjectStream);
    _size = CONCAT44(classId,(int)sVar5);
    TPZContBufferedStream::Write(&mObjectsStream,&size,1);
    TPZContBufferedStream::operator<<(&mObjectsStream,&mCurrentObjectStream);
    mNextPointerToSave = mNextPointerToSave + 1;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Save/TPZPersistenceManager.cpp"
             ,0x6e);
}

Assistant:

void TPZPersistenceManager::WriteToFile(const TPZSavable *obj) {
#ifdef PZDEBUG
    PopulateClassIdMap();
    bool ClassIdError = false;
#endif
    auto objId = ScheduleToWrite(obj);
    unsigned int nMainObjIds = mMainObjIds.size();
    mMainObjIds.resize(nMainObjIds + 1);
    mMainObjIds[nMainObjIds] = objId;

#ifdef PZDEBUG    
    uint64_t written = 0x46;
#endif
    for (; mNextPointerToSave < mPointersToSave.size(); ++mNextPointerToSave) {
        // writes obj-id
        mObjectsStream.Write(&mNextPointerToSave, 1);
        auto pointer = mPointersToSave[mNextPointerToSave];
        // writes classId
        auto classId = pointer->ClassId();
        if (classId == -1 || classId == 666) {
            DebugStop();
        }
#ifdef PZDEBUG
        {
            auto &classidmap = TPZSavable::ClassIdMap();
            if(classidmap.find(classId) == classidmap.end())
            {
                std::cout << "ClassId not registered for a pointer " << classId << std::endl;
                std::cout << "Class name " << typeid(*pointer).name() << std::endl;
                ClassIdError = true;
            }
        }
#endif
        mObjectsStream.Write(&classId, 1);
        // writes object data
        mCurrentObjectStream.clear();
        pointer->Write(mCurrentObjectStream, 0);
        unsigned int size = mCurrentObjectStream.Size();
        mObjectsStream.Write(&size, 1);
        mObjectsStream << mCurrentObjectStream;
#ifdef PZDEBUG
#ifdef VerboseMode_Q
        std::cout << " ObjId: " << mNextPointerToSave
                << " Class name: " << typeid(*pointer).name()
                << " ClassId: " << classId
                << " range: " << written + 1 << " (0x" << std::hex << written + 1 << std::dec << ") - "
                << written + sizeof (int64_t) + 2 * sizeof (int) +size
                << "(0x" << std::hex << written + sizeof (int64_t) + 2 * sizeof (int) +size << ")" << std::dec
                << " size: " << size << std::endl;
        written += sizeof (int64_t) + 2 * sizeof (int) +size;
#endif
#endif
    }
#ifdef PZDEBUG
    if(ClassIdError)
    {
        DebugStop();
    }
#endif
}